

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

QByteArray * __thiscall
QAuthenticatorPrivate::digestMd5Response
          (QByteArray *__return_storage_ptr__,QAuthenticatorPrivate *this,QByteArrayView challenge,
          QByteArrayView method,QByteArrayView path)

{
  char *pcVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  char (*pacVar5) [11];
  Data *pDVar6;
  char *pcVar7;
  storage_type *psVar8;
  qsizetype qVar9;
  qsizetype qVar10;
  storage_type *psVar11;
  int iVar12;
  long in_FS_OFFSET;
  QByteArrayView challenge_00;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QStringBuilder<const_char_(&)[11],_QByteArray> local_1d8;
  QArrayDataPointer<char> local_1b8;
  QArrayDataPointer<char> local_1a0;
  QArrayDataPointer<char> local_188;
  QArrayDataPointer<char> local_170;
  QArrayDataPointer<char> local_158;
  QArrayDataPointer<char> local_140;
  QArrayDataPointer<char> local_128;
  QArrayDataPointer<char> local_108;
  QArrayDataPointer<char> local_e8;
  QArrayDataPointer<char> local_c8;
  QArrayDataPointer<char> local_a8;
  QHash<QByteArray,_QByteArray> options;
  QArrayDataPointer<char> local_88;
  QCryptographicHash hash;
  QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[4]> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  options.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  challenge_00.m_data = (storage_type *)challenge.m_size;
  challenge_00.m_size = (qsizetype)&options;
  parseDigestAuthenticationChallenge(challenge_00);
  iVar12 = this->nonceCount + 1;
  this->nonceCount = iVar12;
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::number((int)&local_a8,iVar12);
  while ((ulong)local_a8.size < (storage_type *)0x8) {
    QByteArray::prepend((QByteArray *)&local_a8,'0');
  }
  local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_68,"nonce",-1);
  QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_c8,&options,(QByteArray *)&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_68,"opaque",-1);
  QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_e8,&options,(QByteArray *)&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_108.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_68,"qop",-1);
  QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_108,&options,(QByteArray *)&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_128.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_158,"algorithm",-1);
  QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_140,&options,(QByteArray *)&local_158);
  QString::toLatin1_helper((QString *)&local_170);
  QString::toLatin1_helper((QString *)&local_188);
  QString::toLatin1_helper((QString *)&local_1a0);
  qVar4 = local_a8.size;
  qVar3 = local_c8.size;
  qVar2 = local_108.size;
  pcVar1 = local_108.ptr;
  qVar10 = path.m_size;
  psVar11 = (storage_type *)(this->cnonce).d.size;
  local_1b8.size = 0;
  local_1b8.d = (Data *)0x0;
  local_1b8.ptr = (char *)0x0;
  _hash = &DAT_aaaaaaaaaaaaaaaa;
  QCryptographicHash::QCryptographicHash(&hash,Md5);
  QVar13.m_data = (storage_type *)local_170.size;
  QVar13.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar13);
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
  QVar14.m_data = psVar8;
  QVar14.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar14);
  QVar15.m_data = (storage_type *)local_188.size;
  QVar15.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar15);
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
  QVar16.m_data = psVar8;
  QVar16.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar16);
  QVar17.m_data = (storage_type *)local_1a0.size;
  QVar17.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar17);
  local_68.a.b.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_68.a.a = (char (*) [11])&DAT_aaaaaaaaaaaaaaaa;
  local_68.a.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QCryptographicHash::result();
  qVar9 = QByteArrayView::lengthHelperCharArray("md5-sess",9);
  iVar12 = qstrnicmp(local_140.ptr,local_140.size,"md5-sess",qVar9);
  if (iVar12 == 0) {
    QCryptographicHash::reset();
    QByteArray::toHex((char)&local_1d8);
    QVar18.m_data = local_1d8.b.d.ptr;
    QVar18.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar18);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1d8);
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
    QVar19.m_data = psVar8;
    QVar19.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar19);
    QVar20.m_data = (storage_type *)qVar3;
    QVar20.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar20);
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
    QVar21.m_data = psVar8;
    QVar21.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar21);
    QVar22.m_data = psVar11;
    QVar22.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar22);
    QCryptographicHash::result();
    pcVar7 = local_68.a.b.d.ptr;
    pDVar6 = local_68.a.b.d.d;
    pacVar5 = local_68.a.a;
    local_68.a.a = local_1d8.a;
    local_68.a.b.d.d = local_1d8.b.d.d;
    local_1d8.a = pacVar5;
    local_1d8.b.d.d = pDVar6;
    local_68.a.b.d.ptr = local_1d8.b.d.ptr;
    local_1d8.b.d.ptr = pcVar7;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1d8);
  }
  QByteArray::toHex((char)&local_1d8);
  pcVar7 = local_68.a.b.d.ptr;
  pDVar6 = local_68.a.b.d.d;
  pacVar5 = local_68.a.a;
  local_68.a.a = local_1d8.a;
  local_68.a.b.d.d = local_1d8.b.d.d;
  local_1d8.a = pacVar5;
  local_1d8.b.d.d = pDVar6;
  local_68.a.b.d.ptr = local_1d8.b.d.ptr;
  local_1d8.b.d.ptr = pcVar7;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1d8);
  QCryptographicHash::reset();
  QVar23.m_data = (storage_type *)method.m_size;
  QVar23.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar23);
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
  QVar24.m_data = psVar8;
  QVar24.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar24);
  QVar25.m_data = (storage_type *)qVar10;
  QVar25.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar25);
  qVar10 = QByteArrayView::lengthHelperCharArray("auth-int",9);
  iVar12 = qstrnicmp(pcVar1,qVar2,"auth-int",qVar10);
  if (iVar12 == 0) {
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
    QVar26.m_data = psVar8;
    QVar26.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar26);
    QVar27.m_data = (storage_type *)0x0;
    QVar27.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar27);
  }
  local_1d8.b.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_1d8.a = (char (*) [11])&DAT_aaaaaaaaaaaaaaaa;
  local_1d8.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QCryptographicHash::result();
  QByteArray::toHex((char)&local_1d8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  QCryptographicHash::reset();
  QVar28.m_data = local_68.a.b.d.ptr;
  QVar28.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar28);
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
  QVar29.m_data = psVar8;
  QVar29.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar29);
  QVar30.m_data = (storage_type *)qVar3;
  QVar30.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar30);
  psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
  QVar31.m_data = psVar8;
  QVar31.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar31);
  if (pcVar1 != (char *)0x0) {
    QVar32.m_data = (storage_type *)qVar4;
    QVar32.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar32);
    psVar8 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
    QVar33.m_data = psVar8;
    QVar33.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar33);
    QVar34.m_data = psVar11;
    QVar34.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar34);
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
    QVar35.m_data = psVar11;
    QVar35.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar35);
    QVar36.m_data = (storage_type *)qVar2;
    QVar36.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar36);
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray(":",2);
    QVar37.m_data = psVar11;
    QVar37.m_size = (qsizetype)&hash;
    QCryptographicHash::addData(QVar37);
  }
  QVar38.m_data = local_1d8.b.d.ptr;
  QVar38.m_size = (qsizetype)&hash;
  QCryptographicHash::addData(QVar38);
  QCryptographicHash::result();
  QByteArray::toHex((char)&local_128);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1d8);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  QCryptographicHash::~QCryptographicHash(&hash);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_1b8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_1a0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_188);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_170);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_140);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_158);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QString::toLatin1_helper((QString *)&local_88);
  local_1d8.b.d.size = local_88.size;
  local_1d8.b.d.ptr = local_88.ptr;
  local_1d8.b.d.d = local_88.d;
  local_1d8.a = (char (*) [11])0x241ff0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char *)0x0;
  local_88.size = 0;
  QStringBuilder<const_char_(&)[11],_QByteArray>::QStringBuilder(&local_68.a,&local_1d8);
  local_68.b = (char (*) [4])0x241ffb;
  ::operator+=(__return_storage_ptr__,&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68.a.b.d);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_1d8.b.d);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  QString::toLatin1_helper((QString *)&local_88);
  local_1d8.b.d.size = local_88.size;
  local_1d8.b.d.ptr = local_88.ptr;
  local_1d8.b.d.d = local_88.d;
  local_1d8.a = (char (*) [11])0x241fff;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char *)0x0;
  local_88.size = 0;
  QStringBuilder<const_char_(&)[8],_QByteArray>::QStringBuilder
            ((QStringBuilder<const_char_(&)[8],_QByteArray> *)&local_68,
             (QStringBuilder<const_char_(&)[8],_QByteArray> *)&local_1d8);
  local_68.b = (char (*) [4])0x241ffb;
  ::operator+=(__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_char_(&)[8],_QByteArray>,_const_char_(&)[4]> *)
               &local_68);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68.a.b.d);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_1d8.b.d);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  local_68.a.a = (char (*) [11])0x242036;
  local_68.a.b.d.d = (Data *)&local_c8;
  local_68.a.b.d.ptr = "\", ";
  ::operator+=(__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_char_(&)[8],_QByteArray_&>,_const_char_(&)[4]> *
               )&local_68);
  local_68.a.a = (char (*) [11])0x242007;
  local_68.a.b.d.d = (Data *)&path;
  local_68.a.b.d.ptr = "\", ";
  ::operator+=(__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_char_(&)[6],_QByteArrayView_&>,_const_char_(&)[4]>
                *)&local_68);
  if ((undefined1 *)local_e8.size != (undefined1 *)0x0) {
    local_68.a.a = (char (*) [11])0x24200d;
    local_68.a.b.d.d = (Data *)&local_e8;
    local_68.a.b.d.ptr = "\", ";
    ::operator+=(__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<const_char_(&)[9],_QByteArray_&>,_const_char_(&)[4]>
                  *)&local_68);
  }
  local_68.a.a = (char (*) [11])0x242016;
  local_68.a.b.d.d = (Data *)&local_128;
  local_68.a.b.d.ptr = (char *)CONCAT71(local_68.a.b.d.ptr._1_7_,0x22);
  ::operator+=(__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray_&>,_char> *)&local_68);
  QByteArray::QByteArray((QByteArray *)&local_1d8,"algorithm",-1);
  QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_68,&options,(QByteArray *)&local_1d8);
  pcVar1 = local_68.a.b.d.ptr;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1d8);
  if ((Data *)pcVar1 != (Data *)0x0) {
    QByteArray::QByteArray((QByteArray *)&local_88,"algorithm",-1);
    QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_1d8,&options,(QByteArray *)&local_88);
    local_68.a.b.d.size = (qsizetype)local_1d8.b.d.ptr;
    local_68.a.b.d.ptr = (char *)local_1d8.b.d.d;
    local_68.a.b.d.d = (Data *)local_1d8.a;
    local_68.a.a = (char (*) [11])0x242021;
    local_1d8.a = (char (*) [11])0x0;
    local_1d8.b.d.d = (Data *)0x0;
    local_1d8.b.d.ptr = (char *)0x0;
    ::operator+=(__return_storage_ptr__,(QStringBuilder<const_char_(&)[13],_QByteArray> *)&local_68)
    ;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68.a.b.d);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1d8);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  }
  QByteArray::QByteArray((QByteArray *)&local_1d8,"qop",-1);
  QHash<QByteArray,_QByteArray>::value((QByteArray *)&local_68,&options,(QByteArray *)&local_1d8);
  pcVar1 = local_68.a.b.d.ptr;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1d8);
  if ((Data *)pcVar1 != (Data *)0x0) {
    local_68.a.a = (char (*) [11])0x24202e;
    local_68.a.b.d.d = (Data *)&local_108;
    local_68.a.b.d.ptr = ", ";
    ::operator+=(__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<const_char_(&)[7],_QByteArray_&>,_const_char_(&)[3]>
                  *)&local_68);
    local_68.a.a = (char (*) [11])0x248118;
    local_68.a.b.d.d = (Data *)&local_a8;
    local_68.a.b.d.ptr = ", ";
    ::operator+=(__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<const_char_(&)[4],_QByteArray_&>,_const_char_(&)[3]>
                  *)&local_68);
    local_68.a.a = (char (*) [11])0x242035;
    local_68.a.b.d.ptr = (char *)CONCAT71(local_68.a.b.d.ptr._1_7_,0x22);
    local_68.a.b.d.d = (Data *)&this->cnonce;
    ::operator+=(__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<const_char_(&)[9],_QByteArray_&>,_char> *)&local_68)
    ;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_128);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_108);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
  QHash<QByteArray,_QByteArray>::~QHash(&options);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QAuthenticatorPrivate::digestMd5Response(QByteArrayView challenge, QByteArrayView method,
                                                    QByteArrayView path)
{
    QHash<QByteArray,QByteArray> options = parseDigestAuthenticationChallenge(challenge);

    ++nonceCount;
    QByteArray nonceCountString = QByteArray::number(nonceCount, 16);
    while (nonceCountString.size() < 8)
        nonceCountString.prepend('0');

    QByteArray nonce = options.value("nonce");
    QByteArray opaque = options.value("opaque");
    QByteArray qop = options.value("qop");

//    qDebug() << "calculating digest: method=" << method << "path=" << path;
    QByteArray response = digestMd5ResponseHelper(options.value("algorithm"), user.toLatin1(),
                                              realm.toLatin1(), password.toLatin1(),
                                              nonce, nonceCountString,
                                              cnonce, qop, method,
                                              path, QByteArray());


    QByteArray credentials;
    credentials += "username=\"" + user.toLatin1() + "\", ";
    credentials += "realm=\"" + realm.toLatin1() + "\", ";
    credentials += "nonce=\"" + nonce + "\", ";
    credentials += "uri=\"" + path + "\", ";
    if (!opaque.isEmpty())
        credentials += "opaque=\"" + opaque + "\", ";
    credentials += "response=\"" + response + '"';
    if (!options.value("algorithm").isEmpty())
        credentials += ", algorithm=" + options.value("algorithm");
    if (!options.value("qop").isEmpty()) {
        credentials += ", qop=" + qop + ", ";
        credentials += "nc=" + nonceCountString + ", ";
        credentials += "cnonce=\"" + cnonce + '"';
    }

    return credentials;
}